

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_function_primitive_isBootstrapPrimitive
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_bitflags_t sVar2;
  undefined1 local_4b;
  _Bool isUndefined;
  _Bool isCorePrimitive;
  size_t flags;
  sysbvm_function_t **functionObject;
  sysbvm_tuple_t *function;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  _Var1 = sysbvm_tuple_isFunction(context,*arguments);
  if (_Var1) {
    sVar2 = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(*arguments + 0x28));
    local_4b = true;
    if ((sVar2 & 4) == 0) {
      local_4b = (_Bool)((*(long *)(*arguments + 0x48) != 0 ^ 0xffU) & 1);
    }
    context_local = (sysbvm_context_t *)sysbvm_tuple_boolean_encode(local_4b);
  }
  else {
    context_local = (sysbvm_context_t *)0xf;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_isBootstrapPrimitive(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    if(!sysbvm_tuple_isFunction(context, *function))
        return SYSBVM_FALSE_TUPLE;
    
    sysbvm_function_t **functionObject = (sysbvm_function_t **)function;
    size_t flags = sysbvm_tuple_bitflags_decode((*functionObject)->flags);
    bool isCorePrimitive = (flags & SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE) != 0;
    bool isUndefined = !(*functionObject)->definition;
    
    return sysbvm_tuple_boolean_encode(isCorePrimitive || isUndefined);
}